

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  diff_match_patch_test dmp_test;
  diff_match_patch_test dStack_38;
  
  diff_match_patch::diff_match_patch(&dStack_38.dmp);
  freopen((char *)0x0,"w",_stdout);
  wprintf(L"Starting diff_match_patch unit tests.");
  wprintf(L"\n");
  diff_match_patch_test::run_all_tests(&dStack_38);
  freopen((char *)0x0,"w",_stdout);
  wprintf(L"Done.");
  wprintf(L"\n");
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  diff_match_patch_test dmp_test;
  dmpDebug(L"Starting diff_match_patch unit tests.");
  dmp_test.run_all_tests();
  dmpDebug(L"Done.");
  return 0;
}